

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<void*>
          (BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,int *i,int *last,uint *targetBucket)

{
  int *piVar1;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
  *pSVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  int **ppiVar5;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
  **ppSVar6;
  EntryType *localEntries;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  uint *targetBucket_local;
  int *last_local;
  int *i_local;
  void **key_local;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  ppiVar5 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  piVar1 = *ppiVar5;
  if (piVar1 != (int *)0x0) {
    hashCode_00 = GetHashCodeWithKey<void*>(key);
    uVar4 = BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,hashCode_00);
    *targetBucket = uVar4;
    *last = -1;
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SimpleDictionaryEntry__
                        ((WriteBarrierPtr *)(this + 8));
    pSVar2 = *ppSVar6;
    *i = piVar1[*targetBucket];
    while (-1 < *i) {
      bVar3 = DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void*>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::KeyEquals<Js::SameValueComparerCommon<void*,true>,void*>
                        ((DefaultHashedEntry<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void*>>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                          *)(pSVar2 + *i),key,hashCode_00);
      if (bVar3) {
        if (*(long *)(this + 0x30) != 0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),localBuckets._4_4_);
        }
        return true;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
      *last = *i;
      *i = pSVar2[*i].
           super_DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           .
           super_KeyValueEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
           .
           super_ValueEntry<Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>_>
           .
           super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
           .next;
    }
  }
  if (*(long *)(this + 0x30) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),localBuckets._4_4_);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }